

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O3

int x25519_init_key(EVP_HPKE_KEY *key,uint8_t *priv_key,size_t priv_key_len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  if (priv_key_len != 0x20) {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x9a);
  }
  else {
    uVar1 = *(undefined8 *)priv_key;
    uVar2 = *(undefined8 *)(priv_key + 8);
    uVar3 = *(undefined8 *)(priv_key + 0x18);
    *(undefined8 *)(key->private_key + 0x10) = *(undefined8 *)(priv_key + 0x10);
    *(undefined8 *)(key->private_key + 0x18) = uVar3;
    *(undefined8 *)key->private_key = uVar1;
    *(undefined8 *)(key->private_key + 8) = uVar2;
    X25519_public_from_private(key->public_key,priv_key);
  }
  return (uint)(priv_key_len == 0x20);
}

Assistant:

static int x25519_init_key(EVP_HPKE_KEY *key, const uint8_t *priv_key,
                           size_t priv_key_len) {
  if (priv_key_len != X25519_PRIVATE_KEY_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  OPENSSL_memcpy(key->private_key, priv_key, priv_key_len);
  X25519_public_from_private(key->public_key, priv_key);
  return 1;
}